

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O0

cJSON * cJSON_ParseWithOpts(char *value,char **return_parse_end,cJSON_bool require_null_terminated)

{
  size_t sVar1;
  size_t buffer_length;
  cJSON_bool require_null_terminated_local;
  char **return_parse_end_local;
  char *value_local;
  
  if (value == (char *)0x0) {
    value_local = (char *)0x0;
  }
  else {
    sVar1 = strlen(value);
    value_local = (char *)cJSON_ParseWithLengthOpts
                                    (value,sVar1 + 1,return_parse_end,require_null_terminated);
  }
  return (cJSON *)value_local;
}

Assistant:

CJSON_PUBLIC(cJSON *) cJSON_ParseWithOpts(const char *value, const char **return_parse_end, cJSON_bool require_null_terminated)
{
    size_t buffer_length;

    if (NULL == value)
    {
        return NULL;
    }

    /* Adding null character size due to require_null_terminated. */
    buffer_length = strlen(value) + sizeof("");

    return cJSON_ParseWithLengthOpts(value, buffer_length, return_parse_end, require_null_terminated);
}